

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O2

void __thiscall mahjong::PatternComputer::check(PatternComputer *this,Meld *meld)

{
  pointer puVar1;
  PatternRecognizer *pPVar2;
  unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_> *it;
  pointer puVar3;
  
  puVar1 = (this->recognizers).
           super__Vector_base<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->recognizers).
                super__Vector_base<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>,_std::allocator<std::unique_ptr<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    pPVar2 = (puVar3->_M_t).
             super___uniq_ptr_impl<mahjong::PatternRecognizer,_std::default_delete<mahjong::PatternRecognizer>_>
             ._M_t.
             super__Tuple_impl<0UL,_mahjong::PatternRecognizer_*,_std::default_delete<mahjong::PatternRecognizer>_>
             .super__Head_base<0UL,_mahjong::PatternRecognizer_*,_false>._M_head_impl;
    (*pPVar2->_vptr_PatternRecognizer[4])(pPVar2,meld);
  }
  return;
}

Assistant:

void PatternComputer::check(const Meld& meld)
{
	for (auto& it : recognizers)
	{
		it->check(meld);
	}
}